

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uchriter.cpp
# Opt level: O3

UBool __thiscall
icu_63::UCharCharacterIterator::operator==
          (UCharCharacterIterator *this,ForwardCharacterIterator *that)

{
  char *__s1;
  char *__s2;
  int iVar1;
  
  if (this == (UCharCharacterIterator *)that) {
    return '\x01';
  }
  __s1 = *(char **)((this->super_CharacterIterator).super_ForwardCharacterIterator.super_UObject.
                    _vptr_UObject[-1] + 8);
  __s2 = *(char **)((that->super_UObject)._vptr_UObject[-1] + 8);
  if ((((__s1 == __s2) || ((*__s1 != '*' && (iVar1 = strcmp(__s1,__s2), iVar1 == 0)))) &&
      ((_func_int **)this->text == that[3].super_UObject._vptr_UObject)) &&
     ((((this->super_CharacterIterator).textLength == *(int *)&that[1].super_UObject._vptr_UObject
       && ((this->super_CharacterIterator).pos ==
           *(int *)((long)&that[1].super_UObject._vptr_UObject + 4))) &&
      ((this->super_CharacterIterator).begin == *(int *)&that[2].super_UObject._vptr_UObject)))) {
    return (this->super_CharacterIterator).end ==
           *(int *)((long)&that[2].super_UObject._vptr_UObject + 4);
  }
  return '\0';
}

Assistant:

UBool
UCharCharacterIterator::operator==(const ForwardCharacterIterator& that) const {
    if (this == &that) {
        return TRUE;
    }
    if (typeid(*this) != typeid(that)) {
        return FALSE;
    }

    UCharCharacterIterator&    realThat = (UCharCharacterIterator&)that;

    return text == realThat.text
        && textLength == realThat.textLength
        && pos == realThat.pos
        && begin == realThat.begin
        && end == realThat.end;
}